

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void compare_numbers<long_long,long_long>(char *description,longlong *expected,longlong *actual)

{
  size_t sVar1;
  ostream *poVar2;
  
  if (*expected == *actual) {
    return;
  }
  if (description == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x15ad70);
  }
  else {
    sVar1 = strlen(description);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,description,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": expected = ",0xd);
  poVar2 = std::ostream::_M_insert<long_long>((longlong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"; actual = ",0xb);
  poVar2 = std::ostream::_M_insert<long_long>((longlong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

static void
compare_numbers(char const* description, T1 const& expected, T2 const& actual)
{
    if (expected != actual) {
        std::cerr << description << ": expected = " << expected << "; actual = " << actual
                  << std::endl;
    }
}